

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool QFontDatabase::isBitmapScalable(QString *family,QString *style)

{
  bool bVar1;
  int iVar2;
  QtFontFamily *pQVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  int k;
  QtFontFoundry *foundry;
  int j;
  QtFontFamily *f;
  QFontDatabasePrivate *d;
  bool bitmapScalable;
  QString foundryName;
  QString familyName;
  Key styleKey;
  QMutexLocker<QRecursiveMutex> locker;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QtFontFoundry *in_stack_ffffffffffffff70;
  int local_88;
  byte local_69;
  undefined4 in_stack_ffffffffffffffa8;
  FamilyRequestFlags in_stack_ffffffffffffffac;
  QString *name;
  QFontDatabasePrivate *this;
  QString *styleString;
  Key *this_00;
  Key local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_69 = 0;
  this_00 = (Key *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x742269);
  name = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QFontDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  styleString = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x742297);
  parseFontName(name,(QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RDI
               );
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff70,
             (QRecursiveMutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  QFontDatabasePrivate::ensureFontDatabase();
  pQVar3 = QFontDatabasePrivate::family(this,name,in_stack_ffffffffffffffac);
  if (pQVar3 == (QtFontFamily *)0x0) {
    local_69 = 0;
  }
  else {
    local_1c = (Key)0xaaaaaaaa;
    QtFontStyle::Key::Key(this_00,styleString);
    for (local_88 = 0; local_88 < pQVar3->count; local_88 = local_88 + 1) {
      in_stack_ffffffffffffff70 = pQVar3->foundries[local_88];
      bVar1 = QString::isEmpty((QString *)0x74237b);
      if ((bVar1) ||
         (iVar2 = QString::compare((QString *)in_stack_ffffffffffffff70,
                                   (CaseSensitivity)&stack0xffffffffffffffb0), iVar2 == 0)) {
        for (iVar2 = 0; iVar2 < in_stack_ffffffffffffff70->count; iVar2 = iVar2 + 1) {
          bVar1 = QString::isEmpty((QString *)0x7423bd);
          if ((((bVar1) ||
               (bVar1 = ::operator==(&in_stack_ffffffffffffff70->name,
                                     (QString *)CONCAT44(iVar2,in_stack_ffffffffffffff68)), bVar1))
              || (bVar1 = QtFontStyle::Key::operator==
                                    (&in_stack_ffffffffffffff70->styles[iVar2]->key,&local_1c),
                 bVar1)) &&
             (((*(uint *)&in_stack_ffffffffffffff70->styles[iVar2]->field_0x4 & 1) != 0 &&
              ((*(uint *)&in_stack_ffffffffffffff70->styles[iVar2]->field_0x4 >> 1 & 1) == 0)))) {
            local_69 = 1;
            goto LAB_00742488;
          }
        }
      }
    }
  }
LAB_00742488:
  QMutexLocker<QRecursiveMutex>::~QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)in_stack_ffffffffffffff70);
  QString::~QString((QString *)0x74249f);
  QString::~QString((QString *)0x7424a9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_69 & 1);
}

Assistant:

bool QFontDatabase::isBitmapScalable(const QString &family,
                                      const QString &style)
{
    bool bitmapScalable = false;
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QtFontFamily *f = d->family(familyName);
    if (!f) return bitmapScalable;

    QtFontStyle::Key styleKey(style);
    for (int j = 0; j < f->count; j++) {
        QtFontFoundry *foundry = f->foundries[j];
        if (foundryName.isEmpty() || foundry->name.compare(foundryName, Qt::CaseInsensitive) == 0) {
            for (int k = 0; k < foundry->count; k++)
                if ((style.isEmpty() ||
                     foundry->styles[k]->styleName == style ||
                     foundry->styles[k]->key == styleKey)
                    && foundry->styles[k]->bitmapScalable && !foundry->styles[k]->smoothScalable) {
                    bitmapScalable = true;
                    goto end;
                }
        }
    }
 end:
    return bitmapScalable;
}